

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

Promise<void> __thiscall
capnproto_test::capnp::test::TestMembrane::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  undefined6 in_register_00000032;
  Promise<void> PVar3;
  PromiseNode *pPVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffffffff) {
  case 0:
    (**(code **)(lVar1 + 8))(this);
    pPVar2 = extraout_RDX;
    break;
  case 1:
    (**(code **)(lVar1 + 0x10))(this);
    pPVar2 = extraout_RDX_03;
    break;
  case 2:
    (**(code **)(lVar1 + 0x18))(this);
    pPVar2 = extraout_RDX_01;
    break;
  case 3:
    (**(code **)(lVar1 + 0x20))(this);
    pPVar2 = extraout_RDX_02;
    break;
  case 4:
    (**(code **)(lVar1 + 0x28))(this);
    pPVar2 = extraout_RDX_00;
    break;
  default:
    PVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x30dd95,0x9c0c);
    pPVar2 = PVar3.super_PromiseBase.node.ptr;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestMembrane::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return makeThing(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::MakeThingParams,  ::capnproto_test::capnp::test::TestMembrane::MakeThingResults>(context));
    case 1:
      return callPassThrough(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context));
    case 2:
      return callIntercept(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::CallInterceptParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context));
    case 3:
      return loopback(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::LoopbackParams,  ::capnproto_test::capnp::test::TestMembrane::LoopbackResults>(context));
    case 4:
      return waitForever(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestMembrane::WaitForeverParams,  ::capnproto_test::capnp::test::TestMembrane::WaitForeverResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestMembrane",
          0xc07d8dcd80a69c0cull, methodId);
  }
}